

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O2

int Gia_Iso2ManCheckIsoPair
              (Gia_Man_t *p,Vec_Int_t *vVec0,Vec_Int_t *vVec1,Vec_Int_t *vMap0,Vec_Int_t *vMap1)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  int i;
  
  i = 0;
  do {
    if (vVec0->nSize <= i) {
      return 1;
    }
    iVar5 = Vec_IntEntry(vVec0,i);
    iVar6 = Vec_IntEntry(vVec1,i);
    if (iVar5 != iVar6) {
      pObj = Gia_ManObj(p,iVar5);
      pObj_00 = Gia_ManObj(p,iVar6);
      if (pObj->Value != pObj_00->Value) {
        return 0;
      }
      uVar1 = *(ulong *)pObj;
      if ((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar1) {
        uVar2 = *(ulong *)pObj_00;
        uVar4 = (uint)(uVar1 >> 0x20);
        uVar3 = (uint)(uVar2 >> 0x20);
        if (pObj[-(uVar1 >> 0x20 & 0x1fffffff)].Value < pObj[-(uVar1 & 0x1fffffff)].Value) {
          if (pObj_00[-(uVar2 & 0x1fffffff)].Value <= pObj_00[-(uVar2 >> 0x20 & 0x1fffffff)].Value)
          {
            if ((((uint)(uVar2 >> 0x1d) & 7 ^ uVar4 >> 0x1d) & 1) != 0) {
              return 0;
            }
            if (((uVar3 ^ (uint)uVar1) >> 0x1d & 1) != 0) {
              return 0;
            }
            iVar5 = Gia_ObjFaninId1p(p,pObj);
            iVar5 = Vec_IntEntry(vMap0,iVar5);
            iVar6 = Gia_ObjFaninId0p(p,pObj_00);
            iVar6 = Vec_IntEntry(vMap1,iVar6);
            if (iVar5 != iVar6) {
              return 0;
            }
            iVar5 = Gia_ObjFaninId0p(p,pObj);
            goto LAB_005e2127;
          }
          if (((uVar2 ^ uVar1) & 0x2000000020000000) != 0) {
            return 0;
          }
          iVar5 = Gia_ObjFaninId1p(p,pObj);
          iVar5 = Vec_IntEntry(vMap0,iVar5);
          iVar6 = Gia_ObjFaninId1p(p,pObj_00);
          iVar6 = Vec_IntEntry(vMap1,iVar6);
          if (iVar5 != iVar6) {
            return 0;
          }
          iVar5 = Gia_ObjFaninId0p(p,pObj);
LAB_005e2032:
          iVar5 = Vec_IntEntry(vMap0,iVar5);
          iVar6 = Gia_ObjFaninId0p(p,pObj_00);
        }
        else {
          if (pObj_00[-(uVar2 >> 0x20 & 0x1fffffff)].Value < pObj_00[-(uVar2 & 0x1fffffff)].Value) {
            if (((uVar3 >> 0x1d ^ (uint)(uVar1 >> 0x1d) & 7) & 1) != 0) {
              return 0;
            }
            if ((((uint)uVar2 ^ uVar4) >> 0x1d & 1) != 0) {
              return 0;
            }
            iVar5 = Gia_ObjFaninId0p(p,pObj);
            iVar5 = Vec_IntEntry(vMap0,iVar5);
            iVar6 = Gia_ObjFaninId1p(p,pObj_00);
            iVar6 = Vec_IntEntry(vMap1,iVar6);
            if (iVar5 != iVar6) {
              return 0;
            }
            iVar5 = Gia_ObjFaninId1p(p,pObj);
            goto LAB_005e2032;
          }
          if (((uVar2 ^ uVar1) & 0x2000000020000000) != 0) {
            return 0;
          }
          iVar5 = Gia_ObjFaninId0p(p,pObj);
          iVar5 = Vec_IntEntry(vMap0,iVar5);
          iVar6 = Gia_ObjFaninId0p(p,pObj_00);
          iVar6 = Vec_IntEntry(vMap1,iVar6);
          if (iVar5 != iVar6) {
            return 0;
          }
          iVar5 = Gia_ObjFaninId1p(p,pObj);
LAB_005e2127:
          iVar5 = Vec_IntEntry(vMap0,iVar5);
          iVar6 = Gia_ObjFaninId1p(p,pObj_00);
        }
        iVar6 = Vec_IntEntry(vMap1,iVar6);
        if (iVar5 != iVar6) {
          return 0;
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Gia_Iso2ManCheckIsoPair( Gia_Man_t * p, Vec_Int_t * vVec0, Vec_Int_t * vVec1, Vec_Int_t * vMap0, Vec_Int_t * vMap1 )
{
    Gia_Obj_t * pObj0, * pObj1;
    int k, iObj0, iObj1;
    Vec_IntForEachEntryTwo( vVec0, vVec1, iObj0, iObj1, k )
    {
        if ( iObj0 == iObj1 )
            continue;
        pObj0 = Gia_ManObj(p, iObj0);
        pObj1 = Gia_ManObj(p, iObj1);
        if ( pObj0->Value != pObj1->Value )
            return 0;
        assert( pObj0->Value == pObj1->Value );
        if ( !Gia_ObjIsAnd(pObj0) )
            continue;
        if ( Gia_ObjFanin0(pObj0)->Value <= Gia_ObjFanin1(pObj0)->Value )
        {
            if ( Gia_ObjFanin0(pObj1)->Value <= Gia_ObjFanin1(pObj1)->Value )
            {
                if ( Gia_ObjFaninC0(pObj0) != Gia_ObjFaninC0(pObj1)  || Gia_ObjFaninC1(pObj0) != Gia_ObjFaninC1(pObj1)   ||
                     Vec_IntEntry(vMap0, Gia_ObjFaninId0p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId0p(p, pObj1)) || 
                     Vec_IntEntry(vMap0, Gia_ObjFaninId1p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId1p(p, pObj1)) )
                     return 0;
            }
            else
            {
                if ( Gia_ObjFaninC0(pObj0) != Gia_ObjFaninC1(pObj1)  || Gia_ObjFaninC1(pObj0) != Gia_ObjFaninC0(pObj1)   ||
                     Vec_IntEntry(vMap0, Gia_ObjFaninId0p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId1p(p, pObj1)) || 
                     Vec_IntEntry(vMap0, Gia_ObjFaninId1p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId0p(p, pObj1)) )
                     return 0;
            }
        }
        else
        {
            if ( Gia_ObjFanin0(pObj1)->Value <= Gia_ObjFanin1(pObj1)->Value )
            {
                if ( Gia_ObjFaninC1(pObj0) != Gia_ObjFaninC0(pObj1)  || Gia_ObjFaninC0(pObj0) != Gia_ObjFaninC1(pObj1)   ||
                     Vec_IntEntry(vMap0, Gia_ObjFaninId1p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId0p(p, pObj1)) || 
                     Vec_IntEntry(vMap0, Gia_ObjFaninId0p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId1p(p, pObj1)) )
                     return 0;
            }
            else
            {
                if ( Gia_ObjFaninC1(pObj0) != Gia_ObjFaninC1(pObj1)  || Gia_ObjFaninC0(pObj0) != Gia_ObjFaninC0(pObj1)   ||
                     Vec_IntEntry(vMap0, Gia_ObjFaninId1p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId1p(p, pObj1)) || 
                     Vec_IntEntry(vMap0, Gia_ObjFaninId0p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId0p(p, pObj1)) )
                     return 0;
            }
        }
    }
    return 1;
}